

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosaraju_scc.cpp
# Opt level: O2

void __thiscall KosarajuSCC::DFS(KosarajuSCC *this,int v,bool *visited,int curr)

{
  uint uVar1;
  pointer pvVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int local_2c;
  
  visited[v] = true;
  (this->scc).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [v] = curr;
  local_2c = v;
  std::vector<int,_std::allocator<int>_>::push_back
            ((this->sccs).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + curr,&local_2c);
  uVar5 = 0;
  while( true ) {
    pvVar2 = (this->ingoing).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&pvVar2[local_2c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)pvVar2[local_2c].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - lVar3 >> 2) <= (ulong)uVar5) break;
    uVar1 = *(uint *)(lVar3 + (ulong)uVar5 * 4);
    iVar4 = (*this->_vptr_KosarajuSCC[2])(this,(ulong)uVar1);
    if ((char)iVar4 == '\0') {
      uVar1 = **(uint **)&(this->ends).
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
      iVar4 = (*this->_vptr_KosarajuSCC[3])(this,(ulong)uVar1);
      if (((char)iVar4 == '\0') && (visited[(int)uVar1] == false)) {
        DFS(this,uVar1,visited,curr);
      }
    }
    uVar5 = uVar5 + 1;
  }
  return;
}

Assistant:

void KosarajuSCC::DFS(int v, bool visited[], int curr) {
	// Mark the current node as visited and print it
	visited[v] = true;
	scc[v] = curr;
	sccs[curr].push_back(v);
	// Recur for all the vertices adjacent to this vertex
	for (unsigned int i = 0; i < ingoing[v].size(); ++i) {
		const int e = ingoing[v][i];
		if (ignore_edge(e)) {
			continue;
		}
		const int u = ends[e][0];
		if (ignore_node(u)) {
			continue;
		}
		if (!visited[u]) {
			DFS(u, visited, curr);
		}
	}
}